

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

double class_matrix(int kind,int m,double alpha,double beta,double *aj,double *bj)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_90;
  double zemu;
  double temp2;
  double temp;
  double pi;
  int i;
  double apone;
  double abti;
  double abj;
  double abi;
  double aba;
  double ab;
  double a2b2;
  double *bj_local;
  double *aj_local;
  double beta_local;
  double alpha_local;
  int m_local;
  int kind_local;
  
  local_90 = 0.0;
  dVar1 = r8_epsilon();
  parchk(kind,m * 2 + -1,alpha,beta);
  dVar2 = r8_gamma(0.5);
  dVar2 = pow(dVar2,2.0);
  dVar2 = r8_abs(dVar2 - 3.141592653589793);
  if (dVar2 <= dVar1 * 500.0) {
    if (kind == 1) {
      local_90 = 2.0;
      for (pi._4_4_ = 0; pi._4_4_ < m; pi._4_4_ = pi._4_4_ + 1) {
        aj[pi._4_4_] = 0.0;
      }
      for (pi._4_4_ = 1; pi._4_4_ <= m; pi._4_4_ = pi._4_4_ + 1) {
        dVar1 = (double)(pi._4_4_ % 2) * 0.0 + (double)pi._4_4_;
        dVar2 = (double)(pi._4_4_ << 1) + 0.0;
        dVar1 = sqrt((dVar1 * dVar1) / (dVar2 * dVar2 + -1.0));
        bj[pi._4_4_ + -1] = dVar1;
      }
    }
    else if (kind == 2) {
      local_90 = 3.141592653589793;
      for (pi._4_4_ = 0; pi._4_4_ < m; pi._4_4_ = pi._4_4_ + 1) {
        aj[pi._4_4_] = 0.0;
      }
      dVar1 = sqrt(0.5);
      *bj = dVar1;
      for (pi._4_4_ = 1; pi._4_4_ < m; pi._4_4_ = pi._4_4_ + 1) {
        bj[pi._4_4_] = 0.5;
      }
    }
    else if (kind == 3) {
      dVar1 = alpha * 2.0;
      dVar2 = pow(2.0,dVar1 + 1.0);
      dVar3 = r8_gamma(alpha + 1.0);
      dVar3 = pow(dVar3,2.0);
      local_90 = r8_gamma(dVar1 + 2.0);
      local_90 = (dVar2 * dVar3) / local_90;
      for (pi._4_4_ = 0; pi._4_4_ < m; pi._4_4_ = pi._4_4_ + 1) {
        aj[pi._4_4_] = 0.0;
      }
      dVar2 = sqrt(1.0 / (alpha + alpha + 3.0));
      *bj = dVar2;
      for (pi._4_4_ = 2; pi._4_4_ <= m; pi._4_4_ = pi._4_4_ + 1) {
        dVar2 = pow((double)pi._4_4_ + alpha,2.0);
        dVar2 = sqrt(((double)pi._4_4_ * ((double)pi._4_4_ + dVar1)) / (dVar2 * 4.0 + -1.0));
        bj[pi._4_4_ + -1] = dVar2;
      }
    }
    else if (kind == 4) {
      dVar1 = alpha + beta;
      dVar2 = dVar1 + 2.0;
      dVar3 = pow(2.0,dVar1 + 1.0);
      dVar4 = r8_gamma(alpha + 1.0);
      dVar5 = r8_gamma(beta + 1.0);
      local_90 = r8_gamma(dVar2);
      local_90 = (dVar3 * dVar4 * dVar5) / local_90;
      *aj = (beta - alpha) / dVar2;
      dVar2 = sqrt(((alpha + 1.0) * 4.0 * (beta + 1.0)) / ((dVar2 + 1.0) * dVar2 * dVar2));
      *bj = dVar2;
      for (pi._4_4_ = 2; pi._4_4_ <= m; pi._4_4_ = pi._4_4_ + 1) {
        dVar2 = (double)pi._4_4_ + (double)pi._4_4_ + dVar1;
        aj[pi._4_4_ + -1] = (beta * beta + -(alpha * alpha)) / ((dVar2 - 2.0) * dVar2);
        dVar2 = sqrt(((double)pi._4_4_ * 4.0 * ((double)pi._4_4_ + alpha) *
                      ((double)pi._4_4_ + beta) * ((double)pi._4_4_ + dVar1)) /
                     ((dVar2 * dVar2 - 1.0) * dVar2 * dVar2));
        bj[pi._4_4_ + -1] = dVar2;
      }
    }
    else if (kind == 5) {
      local_90 = r8_gamma(alpha + 1.0);
      for (pi._4_4_ = 1; pi._4_4_ <= m; pi._4_4_ = pi._4_4_ + 1) {
        aj[pi._4_4_ + -1] = (double)pi._4_4_ + (double)pi._4_4_ + -1.0 + alpha;
        dVar1 = sqrt((double)pi._4_4_ * ((double)pi._4_4_ + alpha));
        bj[pi._4_4_ + -1] = dVar1;
      }
    }
    else if (kind == 6) {
      local_90 = r8_gamma((alpha + 1.0) / 2.0);
      for (pi._4_4_ = 0; pi._4_4_ < m; pi._4_4_ = pi._4_4_ + 1) {
        aj[pi._4_4_] = 0.0;
      }
      for (pi._4_4_ = 1; pi._4_4_ <= m; pi._4_4_ = pi._4_4_ + 1) {
        dVar1 = sqrt((alpha * (double)(pi._4_4_ % 2) + (double)pi._4_4_) / 2.0);
        bj[pi._4_4_ + -1] = dVar1;
      }
    }
    else if (kind == 7) {
      local_90 = 2.0 / (alpha + 1.0);
      for (pi._4_4_ = 0; pi._4_4_ < m; pi._4_4_ = pi._4_4_ + 1) {
        aj[pi._4_4_] = 0.0;
      }
      for (pi._4_4_ = 1; pi._4_4_ <= m; pi._4_4_ = pi._4_4_ + 1) {
        dVar1 = alpha * (double)(pi._4_4_ % 2) + (double)pi._4_4_;
        dVar2 = (double)(pi._4_4_ << 1) + alpha;
        dVar1 = sqrt((dVar1 * dVar1) / (dVar2 * dVar2 + -1.0));
        bj[pi._4_4_ + -1] = dVar1;
      }
    }
    else if (kind == 8) {
      dVar1 = alpha + beta;
      dVar2 = r8_gamma(alpha + 1.0);
      dVar3 = r8_gamma(-(dVar1 + 1.0));
      local_90 = r8_gamma(-beta);
      local_90 = (dVar2 * dVar3) / local_90;
      *aj = -(alpha + 1.0) / (dVar1 + 2.0);
      *bj = ((-*aj * (beta + 1.0)) / (dVar1 + 2.0)) / (dVar1 + 3.0);
      for (pi._4_4_ = 2; pi._4_4_ <= m; pi._4_4_ = pi._4_4_ + 1) {
        dVar2 = (double)pi._4_4_ + (double)pi._4_4_ + dVar1;
        aj[pi._4_4_ + -1] =
             (dVar1 + (double)pi._4_4_) * 2.0 * (double)(pi._4_4_ + -1) + dVar1 * (alpha + 1.0);
        aj[pi._4_4_ + -1] = (-aj[pi._4_4_ + -1] / dVar2) / (dVar2 - 2.0);
      }
      for (pi._4_4_ = 2; pi._4_4_ <= m + -1; pi._4_4_ = pi._4_4_ + 1) {
        dVar2 = (double)pi._4_4_ + (double)pi._4_4_ + dVar1;
        bj[pi._4_4_ + -1] =
             ((((((double)pi._4_4_ * (alpha + (double)pi._4_4_)) / (dVar2 - 1.0)) *
               (beta + (double)pi._4_4_)) / (dVar2 * dVar2)) * (dVar1 + (double)pi._4_4_)) /
             (dVar2 + 1.0);
      }
      bj[m + -1] = 0.0;
      for (pi._4_4_ = 0; pi._4_4_ < m; pi._4_4_ = pi._4_4_ + 1) {
        dVar1 = sqrt(bj[pi._4_4_]);
        bj[pi._4_4_] = dVar1;
      }
    }
    else if (kind == 9) {
      local_90 = 1.5707963267948966;
      for (pi._4_4_ = 0; pi._4_4_ < m; pi._4_4_ = pi._4_4_ + 1) {
        aj[pi._4_4_] = 0.0;
      }
      for (pi._4_4_ = 0; pi._4_4_ < m; pi._4_4_ = pi._4_4_ + 1) {
        bj[pi._4_4_] = 0.5;
      }
    }
    return local_90;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"CLASS_MATRIX - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Gamma function does not match machine parameters.\n");
  exit(1);
}

Assistant:

double class_matrix ( int kind, int m, double alpha, double beta, double aj[], 
  double bj[] )

//****************************************************************************80
//
//  Purpose:
//
//    CLASS_MATRIX computes the Jacobi matrix for a quadrature rule.
//
//  Discussion:
//
//    This routine computes the diagonal AJ and sub-diagonal BJ
//    elements of the order M tridiagonal symmetric Jacobi matrix
//    associated with the polynomials orthogonal with respect to
//    the weight function specified by KIND.
//
//    For weight functions 1-7, M elements are defined in BJ even
//    though only M-1 are needed.  For weight function 8, BJ(M) is
//    set to zero.
//
//    The zero-th moment of the weight function is returned in ZEMU.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 February 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int KIND, the rule.
//    1, Legendre,             (a,b)       1.0
//    2, Chebyshev Type 1,     (a,b)       ((b-x)*(x-a))^(-0.5)
//    3, Gegenbauer,           (a,b)       ((b-x)*(x-a))^alpha
//    4, Jacobi,               (a,b)       (b-x)^alpha*(x-a)^beta
//    5, Generalized Laguerre, (a,+oo)     (x-a)^alpha*exp(-b*(x-a))
//    6, Generalized Hermite,  (-oo,+oo)   |x-a|^alpha*exp(-b*(x-a)^2)
//    7, Exponential,          (a,b)       |x-(a+b)/2.0|^alpha
//    8, Rational,             (a,+oo)     (x-a)^alpha*(x+b)^beta
//    9, Chebyshev Type 2,     (a,b)       ((b-x)*(x-a))^(+0.5)
//
//    Input, int M, the order of the Jacobi matrix.
//
//    Input, double ALPHA, the value of Alpha, if needed.
//
//    Input, double BETA, the value of Beta, if needed.
//
//    Output, double AJ[M], BJ[M], the diagonal and subdiagonal
//    of the Jacobi matrix.
//
//    Output, double CLASS_MATRIX, the zero-th moment.
//
{
  double a2b2;
  double ab;
  double aba;
  double abi;
  double abj;
  double abti;
  double apone;
  int i;
  double pi = 3.14159265358979323846264338327950;
  double temp;
  double temp2;
  double zemu = 0.0; // Uninitialized warning.

  temp = r8_epsilon ( );

  parchk ( kind, 2 * m - 1, alpha, beta );

  temp2 = 0.5;

  if ( 500.0 * temp < r8_abs ( pow ( r8_gamma ( temp2 ), 2 ) - pi ) )
  {
    std::cerr << "\n";
    std::cerr << "CLASS_MATRIX - Fatal error!\n";
    std::cerr << "  Gamma function does not match machine parameters.\n";
    exit ( 1 );
  }

  if ( kind == 1 )
  {
    ab = 0.0;

    zemu = 2.0 / ( ab + 1.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 1; i <= m; i++ )
    {
      abi = i + ab * ( i % 2 );
      abj = 2 * i + ab;
      bj[i-1] = sqrt ( abi * abi / ( abj * abj - 1.0 ) );
    }
  }
  else if ( kind == 2 )
  {
    zemu = pi;

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    bj[0] = sqrt ( 0.5 );
    for ( i = 1; i < m; i++ )
    {
      bj[i] = 0.5;
    }
  }
  else if ( kind == 3 )
  {
    ab = alpha * 2.0;
    zemu = pow ( 2.0, ab + 1.0 ) * pow ( r8_gamma ( alpha + 1.0 ), 2 )
      / r8_gamma ( ab + 2.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    bj[0] = sqrt ( 1.0 / ( 2.0 * alpha + 3.0 ) );
    for ( i = 2; i <= m; i++ )
    {
      bj[i-1] = sqrt ( i * ( i + ab ) / ( 4.0 * pow ( i + alpha, 2 ) - 1.0 ) );
    }
  }
  else if ( kind == 4 )
  {
    ab = alpha + beta;
    abi = 2.0 + ab;
    zemu = pow ( 2.0, ab + 1.0 ) * r8_gamma ( alpha + 1.0 ) 
      * r8_gamma ( beta + 1.0 ) / r8_gamma ( abi );
    aj[0] = ( beta - alpha ) / abi;
    bj[0] = sqrt ( 4.0 * ( 1.0 + alpha ) * ( 1.0 + beta ) 
      / ( ( abi + 1.0 ) * abi * abi ) );
    a2b2 = beta * beta - alpha * alpha;

    for ( i = 2; i <= m; i++ )
    {
      abi = 2.0 * i + ab;
      aj[i-1] = a2b2 / ( ( abi - 2.0 ) * abi );
      abi = abi * abi;
      bj[i-1] = sqrt ( 4.0 * i * ( i + alpha ) * ( i + beta ) * ( i + ab ) 
        / ( ( abi - 1.0 ) * abi ) );
    }
  }
  else if ( kind == 5 )
  {
    zemu = r8_gamma ( alpha + 1.0 );

    for ( i = 1; i <= m; i++ )
    {
      aj[i-1] = 2.0 * i - 1.0 + alpha;
      bj[i-1] = sqrt ( i * ( i + alpha ) );
    }
  }
  else if ( kind == 6 )
  {
    zemu = r8_gamma ( ( alpha + 1.0 ) / 2.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 1; i <= m; i++ )
    {
      bj[i-1] = sqrt ( ( i + alpha * ( i % 2 ) ) / 2.0 );
    }
  }
  else if ( kind == 7 )
  {
    ab = alpha;
    zemu = 2.0 / ( ab + 1.0 );

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 1; i <= m; i++ )
    {
      abi = i + ab * ( i % 2 );
      abj = 2 * i + ab;
      bj[i-1] = sqrt ( abi * abi / ( abj * abj - 1.0 ) );
    }
  }
  else if ( kind == 8 )
  {
    ab = alpha + beta;
    zemu = r8_gamma ( alpha + 1.0 ) * r8_gamma ( - ( ab + 1.0 ) ) 
      / r8_gamma ( - beta );
    apone = alpha + 1.0;
    aba = ab * apone;
    aj[0] = - apone / ( ab + 2.0 );
    bj[0] = - aj[0] * ( beta + 1.0 ) / ( ab + 2.0 ) / ( ab + 3.0 );
    for ( i = 2; i <= m; i++ )
    {
      abti = ab + 2.0 * i;
      aj[i-1] = aba + 2.0 * ( ab + i ) * ( i - 1 );
      aj[i-1] = - aj[i-1] / abti / ( abti - 2.0 );
    }

    for ( i = 2; i <= m - 1; i++ )
    {
      abti = ab + 2.0 * i;
      bj[i-1] = i * ( alpha + i ) / ( abti - 1.0 ) * ( beta + i ) 
        / ( abti * abti ) * ( ab + i ) / ( abti + 1.0 );
    }
    bj[m-1] = 0.0;
    for ( i = 0; i < m; i++ )
    {
      bj[i] = sqrt ( bj[i] );
    }
  }
  else if ( kind == 9 )
  {
    zemu = pi / 2.0;

    for ( i = 0; i < m; i++ )
    {
      aj[i] = 0.0;
    }

    for ( i = 0; i < m; i++ )
    {
      bj[i] = 0.5;
    }
  }

  return zemu;
}